

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O0

MessageProcessingResult __thiscall
helics::TimeCoordinator::checkExecEntry(TimeCoordinator *this,GlobalFederateId triggerFed)

{
  GlobalFederateId gid;
  Time testTime;
  bool bVar1;
  __int_type_conflict _Var2;
  int iVar3;
  int *piVar4;
  TimeRepresentation<count_time<9,_long>_> TVar5;
  DependencyInfo *pDVar6;
  BaseType in_ESI;
  TimeDependencies *in_RDI;
  DependencyInfo *tfed_1;
  DependencyInfo *mfed_1;
  ActionMessage execgrant_2;
  ActionMessage execgrant_1;
  ActionMessage execgrant;
  DependencyInfo *dep;
  iterator __end5;
  iterator __begin5;
  TimeDependencies *__range5;
  int restrictionLevel;
  bool restrictionAdvance;
  bool restricted;
  bool allowed;
  bool sendAll;
  DependencyInfo *tfed;
  DependencyInfo *mfed;
  MessageProcessingResult ret;
  TimeDependencies *in_stack_fffffffffffffc38;
  int32_t iVar7;
  ActionMessage *in_stack_fffffffffffffc40;
  ActionMessage *this_00;
  TimeRepresentation<count_time<9,_long>_> *in_stack_fffffffffffffc48;
  undefined8 in_stack_fffffffffffffc58;
  action_t startingAction;
  ActionMessage *in_stack_fffffffffffffc60;
  MessageProcessingResult local_395;
  MessageProcessingResult local_393;
  MessageProcessingResult local_391;
  ActionMessage *in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc78;
  undefined2 in_stack_fffffffffffffc7c;
  undefined1 in_stack_fffffffffffffc7e;
  undefined1 in_stack_fffffffffffffc7f;
  char cVar8;
  undefined8 in_stack_fffffffffffffc80;
  GlobalFederateId GVar9;
  undefined4 in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc94;
  ConnectionType CVar10;
  undefined4 in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffc9c;
  undefined8 in_stack_fffffffffffffca0;
  GlobalFederateId local_344;
  GlobalFederateId local_340;
  undefined4 local_33c;
  DependencyInfo *local_338;
  GlobalFederateId local_32c [3];
  undefined4 local_320;
  pointer local_308;
  int32_t in_stack_fffffffffffffd64;
  TimeCoordinator *in_stack_fffffffffffffd68;
  GlobalFederateId in_stack_fffffffffffffd70;
  GlobalFederateId in_stack_fffffffffffffd74;
  GlobalFederateId local_254;
  ActionMessage local_250;
  GlobalFederateId local_198 [4];
  ActionMessage local_188;
  uint local_d0;
  BaseType local_cc;
  reference local_c8;
  DependencyInfo *local_c0;
  __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  local_b8;
  pointer *local_b0;
  int local_a8;
  byte local_a3;
  byte local_a2;
  byte local_a1;
  undefined4 local_a0;
  undefined4 local_9c;
  undefined1 local_98 [75];
  byte local_4d;
  GlobalFederateId local_4c;
  BaseType local_48;
  BaseType local_44;
  DependencyInfo *local_40;
  GlobalFederateId local_34;
  BaseType local_30;
  BaseType local_2c;
  GlobalFederateId local_28;
  undefined4 local_24;
  DependencyInfo *local_20;
  MessageProcessingResult local_11;
  GlobalFederateId local_8 [2];
  
  local_11 = CONTINUE_PROCESSING;
  local_8[0].gid = in_ESI;
  bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<=
                    ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0xc),
                     (TimeRepresentation<count_time<9,_long>_> *)&helics::timeZero);
  if (bVar1) {
    return local_11;
  }
  bVar1 = TimeDependencies::checkIfReadyForExecEntry
                    (in_RDI,SUB81((ulong)in_stack_fffffffffffffc80 >> 0x38,0),
                     SUB81((ulong)in_stack_fffffffffffffc80 >> 0x30,0));
  startingAction = (action_t)((ulong)in_stack_fffffffffffffc58 >> 0x20);
  if (!bVar1) {
    if ((in_RDI[0x12].mDelayedDependency.gid & 0x10000) == 0) {
      bVar1 = GlobalFederateId::isValid(local_8);
      CVar10 = (ConnectionType)((uint)in_stack_fffffffffffffc94 >> 0x18);
      if ((bVar1) && (*(char *)((long)&in_RDI[0x12].mDelayedDependency.gid + 1) != '\0')) {
        bVar1 = TimeDependencies::checkIfReadyForExecEntry
                          (in_RDI,SUB81((ulong)in_stack_fffffffffffffc80 >> 0x38,0),
                           SUB81((ulong)in_stack_fffffffffffffc80 >> 0x30,0));
        if (bVar1) {
          local_24 = *(undefined4 *)
                      &in_RDI[2].dependencies.
                       super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
          memset(&local_28,0,4);
          GlobalFederateId::GlobalFederateId(&local_28);
          local_20 = getExecEntryMinFederate
                               ((TimeDependencies *)
                                CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                                (GlobalFederateId)
                                (BaseType)((ulong)in_stack_fffffffffffffca0 >> 0x20),CVar10,
                                (GlobalFederateId)(BaseType)in_stack_fffffffffffffca0);
          local_2c = local_8[0].gid;
          bVar1 = GlobalFederateId::operator==(&local_20->fedID,local_8[0]);
          if (bVar1) {
            local_30 = local_8[0].gid;
            memset(&local_34,0,4);
            GlobalFederateId::GlobalFederateId(&local_34);
            sendUpdatedExecRequest
                      (in_stack_fffffffffffffd68,in_stack_fffffffffffffd74,in_stack_fffffffffffffd70
                       ,in_stack_fffffffffffffd64);
          }
          else {
            local_44 = local_8[0].gid;
            GVar9.gid._2_1_ = in_stack_fffffffffffffc7e;
            GVar9.gid._0_2_ = in_stack_fffffffffffffc7c;
            GVar9.gid._3_1_ = in_stack_fffffffffffffc7f;
            local_40 = TimeDependencies::getDependencyInfo
                                 ((TimeDependencies *)in_stack_fffffffffffffc70,GVar9);
            if ((local_40->dependent & 1U) != 0) {
              local_48 = local_8[0].gid;
              memset(&local_4c,0,4);
              GlobalFederateId::GlobalFederateId(&local_4c);
              sendUpdatedExecRequest
                        (in_stack_fffffffffffffd68,in_stack_fffffffffffffd74,
                         in_stack_fffffffffffffd70,in_stack_fffffffffffffd64);
            }
          }
        }
        else {
          in_RDI[0x12].field_0x1c = 1;
        }
      }
    }
    return local_11;
  }
  local_4d = in_RDI[0x12].field_0x1c & 1;
  in_RDI[0x12].field_0x1c = 0;
  cVar8 = *(char *)((long)&in_RDI[0x12].mDelayedDependency.gid + 1);
  if (cVar8 == '\0') {
    if (((ulong)in_RDI[0x12].dependencies.
                super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage & 1) == 0) {
      local_11 = NEXT_STEP;
    }
    else {
      in_stack_fffffffffffffc70 =
           (ActionMessage *)
           &(in_RDI->dependencies).
            super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
            _M_impl.super__Vector_impl_data._M_finish;
      in_stack_fffffffffffffc7e = 1;
      if (((ulong)in_RDI[0x12].dependencies.
                  super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage & 0x10000) == 0) {
        in_stack_fffffffffffffc7e = in_RDI[0x12].field_0x1e;
      }
      local_9c = *(undefined4 *)
                  &in_RDI[2].dependencies.
                   super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      local_a0 = *(undefined4 *)
                  &in_RDI[2].dependencies.
                   super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      generateMinTimeTotal
                ((TimeDependencies *)
                 (ulong)CONCAT16(in_stack_fffffffffffffc7e,
                                 CONCAT24(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78)),
                 SUB81((ulong)in_stack_fffffffffffffc70 >> 0x38,0),
                 (GlobalFederateId)(BaseType)((ulong)in_stack_fffffffffffffc80 >> 0x20),
                 (GlobalFederateId)(BaseType)in_stack_fffffffffffffc80,
                 (int32_t)in_stack_fffffffffffffc70);
      memcpy(in_RDI + 5,local_98,0x48);
      bVar1 = TimeRepresentation<count_time<9,_long>_>::operator>
                        ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 5),
                         (TimeRepresentation<count_time<9,_long>_> *)&helics::timeZero);
      if (bVar1) {
        local_11 = NEXT_STEP;
      }
    }
    goto LAB_00552f28;
  }
  if (1 < (byte)(cVar8 - 1U)) goto LAB_00552f28;
  _Var2 = std::__atomic_base::operator_cast_to_int((__atomic_base<int> *)in_stack_fffffffffffffc48);
  startingAction = (action_t)((ulong)in_stack_fffffffffffffc58 >> 0x20);
  if (*(int *)((long)&in_RDI[0x12].dependencies.
                      super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) <= _Var2) {
    if (*(char *)((long)&in_RDI[0x12].mDelayedDependency.gid + 1) == '\x01') {
      local_11 = ITERATING;
    }
    else {
      local_11 = NEXT_STEP;
    }
    goto LAB_00552f28;
  }
  if ((in_RDI[0x12].mDelayedDependency.gid & 0x10000) != 0) {
    local_11 = ITERATING;
    goto LAB_00552f28;
  }
  bVar1 = TimeDependencies::checkIfReadyForExecEntry
                    (in_RDI,SUB81((ulong)in_stack_fffffffffffffc80 >> 0x38,0),
                     SUB81((ulong)in_stack_fffffffffffffc80 >> 0x30,0));
  startingAction = (action_t)((ulong)in_stack_fffffffffffffc58 >> 0x20);
  if (bVar1) {
LAB_00552c2a:
    local_391 = ITERATING;
    if (*(char *)((long)&in_RDI[0x12].mDelayedDependency.gid + 1) != '\x01') {
      local_391 = NEXT_STEP;
    }
    local_11 = local_391;
  }
  else {
    if (((ulong)in_RDI[0x12].dependencies.
                super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage & 1) != 0) {
      bVar1 = TimeDependencies::checkIfAllDependenciesArePastExec
                        ((TimeDependencies *)in_stack_fffffffffffffc60,
                         SUB81((ulong)in_stack_fffffffffffffc58 >> 0x38,0));
      startingAction = (action_t)((ulong)in_stack_fffffffffffffc58 >> 0x20);
      if (bVar1) goto LAB_00552c2a;
    }
    startingAction = (action_t)((ulong)in_stack_fffffffffffffc58 >> 0x20);
    local_a1 = (*(byte *)&in_RDI[0x12].dependencies.
                          super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage ^ 0xff) & 1;
    local_a3 = *(byte *)((long)&in_RDI[0x12].dependencies.
                                super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 2) & 1;
    local_a8 = 0x32;
    local_a2 = local_a3;
    if (local_a1 != 0) {
      local_b0 = &(in_RDI->dependencies).
                  super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      local_b8._M_current = (DependencyInfo *)TimeDependencies::begin(in_stack_fffffffffffffc38);
      local_c0 = (DependencyInfo *)TimeDependencies::end(in_stack_fffffffffffffc38);
      while( true ) {
        bVar1 = __gnu_cxx::
                operator==<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                          ((__normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                            *)in_stack_fffffffffffffc40,
                           (__normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                            *)in_stack_fffffffffffffc38);
        startingAction = (action_t)((ulong)in_stack_fffffffffffffc58 >> 0x20);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        local_c8 = __gnu_cxx::
                   __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                   ::operator*(&local_b8);
        startingAction = (action_t)((ulong)in_stack_fffffffffffffc58 >> 0x20);
        if ((local_c8->dependency & 1U) != 0) {
          if ((local_c8->super_TimeData).mTimeState == initialized) {
            local_a1 = 0;
            local_a3 = 0;
            break;
          }
          if ((local_c8->super_TimeData).mTimeState < exec_requested) {
            local_cc = *(BaseType *)
                        &in_RDI[2].dependencies.
                         super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
            bVar1 = GlobalFederateId::operator!=
                              (&(local_c8->super_TimeData).minFed,(GlobalFederateId)local_cc);
            startingAction = (action_t)((ulong)in_stack_fffffffffffffc58 >> 0x20);
            if (bVar1) {
              local_a1 = 0;
            }
            if ((local_c8->super_TimeData).responseSequenceCounter !=
                *(int *)((long)&in_RDI[2].dependencies.
                                super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                                ._M_impl.super__Vector_impl_data._M_finish + 4)) {
              local_a3 = 0;
              local_a1 = 0;
              break;
            }
            if ((local_a2 & 1) != 0) {
              local_d0 = (uint)(local_c8->super_TimeData).restrictionLevel;
              piVar4 = CLI::std::min<int>(&local_a8,(int *)&local_d0);
              local_a8 = *piVar4;
            }
          }
        }
        __gnu_cxx::
        __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
        ::operator++(&local_b8);
      }
    }
    if ((local_a1 & 1) == 0) {
      if ((local_a3 & 1) != 0) {
        *(char *)&in_RDI[0x12].mDelayedDependency.gid = (char)local_a8 + '\x01';
        local_4d = 1;
        *(int *)((long)&in_RDI[2].dependencies.
                        super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                        ._M_impl.super__Vector_impl_data._M_finish + 4) =
             *(int *)((long)&in_RDI[2].dependencies.
                             super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 4) + 1;
      }
      local_11 = CONTINUE_PROCESSING;
    }
    else if ((local_a2 & 1) == 0) {
      local_395 = ITERATING;
      if (*(char *)((long)&in_RDI[0x12].mDelayedDependency.gid + 1) != '\x01') {
        local_395 = NEXT_STEP;
      }
      local_11 = local_395;
    }
    else if (local_a8 < 1) {
      if ((uint)(byte)in_RDI[0x12].mDelayedDependency.gid != local_a8 + 1U) {
        *(char *)&in_RDI[0x12].mDelayedDependency.gid = (char)local_a8 + '\x01';
        local_4d = 1;
        *(int *)((long)&in_RDI[2].dependencies.
                        super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                        ._M_impl.super__Vector_impl_data._M_finish + 4) =
             *(int *)((long)&in_RDI[2].dependencies.
                             super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 4) + 1;
      }
      local_11 = CONTINUE_PROCESSING;
    }
    else {
      local_393 = ITERATING;
      if (*(char *)((long)&in_RDI[0x12].mDelayedDependency.gid + 1) != '\x01') {
        local_393 = NEXT_STEP;
      }
      local_11 = local_393;
    }
  }
LAB_00552f28:
  GVar9.gid = (BaseType)((ulong)in_stack_fffffffffffffc80 >> 0x20);
  if ((in_RDI[0x12].field_0x1f & 1) == 0) {
    if (local_11 == NEXT_STEP) {
      in_RDI[9].dependencies.
      super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      *(pointer *)&in_RDI[0xb].mDelayedDependency =
           in_RDI[9].dependencies.
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      *(undefined1 *)
       ((long)&in_RDI[2].dependencies.
               super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage + 3) = 1;
      std::__atomic_base<int>::operator=
                ((__atomic_base<int> *)in_stack_fffffffffffffc48,
                 (__int_type_conflict)((ulong)in_stack_fffffffffffffc40 >> 0x20));
      CVar10 = (ConnectionType)((uint)in_stack_fffffffffffffc94 >> 0x18);
      iVar7 = (int32_t)((ulong)in_stack_fffffffffffffc38 >> 0x20);
      *(undefined1 *)&in_RDI[0x12].mDelayedDependency.gid = 0;
      ActionMessage::ActionMessage(&local_188,startingAction);
      local_188.source_id.gid =
           *(BaseType *)
            &in_RDI[2].dependencies.
             super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
             _M_impl.super__Vector_impl_data._M_finish;
      ActionMessage::setExtraDestData(in_stack_fffffffffffffc40,iVar7);
      local_198[0].gid = 0;
      GlobalFederateId::GlobalFederateId(local_198);
      transmitTimingMessages
                ((TimeCoordinator *)
                 CONCAT17(cVar8,CONCAT16(in_stack_fffffffffffffc7e,
                                         CONCAT24(in_stack_fffffffffffffc7c,
                                                  in_stack_fffffffffffffc78))),
                 in_stack_fffffffffffffc70,GVar9);
      ActionMessage::~ActionMessage(in_stack_fffffffffffffc40);
    }
    else {
      if (local_11 == ITERATING) {
        TimeDependencies::resetIteratingExecRequests((TimeDependencies *)in_stack_fffffffffffffc60);
        iVar7 = (int32_t)((ulong)in_stack_fffffffffffffc38 >> 0x20);
        *(undefined1 *)((long)&in_RDI[0x12].mDelayedDependency.gid + 2) = 0;
        std::__atomic_base<int>::operator++((__atomic_base<int> *)(in_RDI + 0x13));
        ActionMessage::ActionMessage
                  (in_stack_fffffffffffffc60,(action_t)((ulong)&local_250 >> 0x20));
        local_250.source_id.gid =
             *(BaseType *)
              &in_RDI[2].dependencies.
               super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
               _M_impl.super__Vector_impl_data._M_finish;
        _Var2 = std::__atomic_base::operator_cast_to_int
                          ((__atomic_base<int> *)in_stack_fffffffffffffc48);
        local_250.counter = (uint16_t)_Var2;
        ActionMessage::setExtraDestData(in_stack_fffffffffffffc40,iVar7);
        setActionFlag<helics::ActionMessage,helics::TimingFlags>
                  (&local_250,iteration_requested_flag);
        local_254.gid = 0;
        GlobalFederateId::GlobalFederateId(&local_254);
        transmitTimingMessages
                  ((TimeCoordinator *)
                   CONCAT17(cVar8,CONCAT16(in_stack_fffffffffffffc7e,
                                           CONCAT24(in_stack_fffffffffffffc7c,
                                                    in_stack_fffffffffffffc78))),
                   in_stack_fffffffffffffc70,GVar9);
        *(undefined1 *)&in_RDI[0x12].mDelayedDependency.gid = 0;
        ActionMessage::~ActionMessage(in_stack_fffffffffffffc40);
      }
      CVar10 = (ConnectionType)((uint)in_stack_fffffffffffffc94 >> 0x18);
    }
  }
  else {
    if (local_11 == NEXT_STEP) {
      (*(code *)(((in_RDI->dependencies).
                  super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start)->super_TimeData).minDe.internalTimeCode
      )();
      iVar3 = BaseTimeCoordinator::dependencyCount((BaseTimeCoordinator *)0x553157);
      if (iVar3 < 1) {
        in_RDI[9].dependencies.
        super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      }
      else {
        testTime.internalTimeCode._4_4_ = in_stack_fffffffffffffc9c;
        testTime.internalTimeCode._0_4_ = in_stack_fffffffffffffc98;
        generateAllowedTime((TimeCoordinator *)
                            CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),testTime);
        std::max<TimeRepresentation<count_time<9,long>>>
                  ((TimeRepresentation<count_time<9,_long>_> *)in_stack_fffffffffffffc38,
                   (TimeRepresentation<count_time<9,_long>_> *)0x5531a4);
        TVar5 = TimeRepresentation<count_time<9,_long>_>::operator-
                          (in_stack_fffffffffffffc48,
                           (TimeRepresentation<count_time<9,_long>_> *)in_stack_fffffffffffffc40);
        in_RDI[9].dependencies.
        super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)TVar5.internalTimeCode;
      }
      iVar7 = (int32_t)((ulong)in_stack_fffffffffffffc38 >> 0x20);
      this_00 = (ActionMessage *)
                &in_RDI[9].dependencies.
                 super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      *(pointer *)&in_RDI[0xb].mDelayedDependency =
           in_RDI[9].dependencies.
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      *(undefined1 *)
       ((long)&in_RDI[2].dependencies.
               super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage + 3) = 1;
      std::__atomic_base<int>::operator=
                ((__atomic_base<int> *)in_stack_fffffffffffffc48,
                 (__int_type_conflict)((ulong)this_00 >> 0x20));
      *(undefined1 *)&in_RDI[0x12].mDelayedDependency.gid = 0;
      TimeRepresentation<count_time<9,_long>_>::operator>
                ((TimeRepresentation<count_time<9,_long>_> *)this_00,
                 (TimeRepresentation<count_time<9,_long>_> *)&helics::timeZero);
      ActionMessage::ActionMessage(in_stack_fffffffffffffc60,startingAction);
      local_320 = *(undefined4 *)
                   &in_RDI[2].dependencies.
                    super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
      local_308 = in_RDI[9].dependencies.
                  super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      ActionMessage::setExtraDestData(this_00,iVar7);
      local_32c[0].gid = 0;
      GlobalFederateId::GlobalFederateId(local_32c);
      transmitTimingMessages
                ((TimeCoordinator *)
                 CONCAT17(cVar8,CONCAT16(in_stack_fffffffffffffc7e,
                                         CONCAT24(in_stack_fffffffffffffc7c,
                                                  in_stack_fffffffffffffc78))),
                 in_stack_fffffffffffffc70,GVar9);
      ActionMessage::~ActionMessage(this_00);
    }
    CVar10 = (ConnectionType)((uint)in_stack_fffffffffffffc94 >> 0x18);
  }
  bVar1 = GlobalFederateId::isValid(local_8);
  if (((bVar1) && (local_11 == CONTINUE_PROCESSING)) &&
     (*(char *)((long)&in_RDI[0x12].mDelayedDependency.gid + 1) != '\0')) {
    local_33c = *(undefined4 *)
                 &in_RDI[2].dependencies.
                  super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    memset(&local_340,0,4);
    GlobalFederateId::GlobalFederateId(&local_340);
    local_338 = getExecEntryMinFederate
                          ((TimeDependencies *)
                           CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                           (GlobalFederateId)(BaseType)((ulong)in_stack_fffffffffffffca0 >> 0x20),
                           CVar10,(GlobalFederateId)(BaseType)in_stack_fffffffffffffca0);
    if ((local_4d & 1) == 0) {
      bVar1 = GlobalFederateId::operator!=
                        (local_8,(GlobalFederateId)
                                 *(BaseType *)
                                  &in_RDI[2].dependencies.
                                   super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                                   ._M_impl.super__Vector_impl_data._M_finish);
      if (bVar1) {
        bVar1 = GlobalFederateId::operator==(local_8,(GlobalFederateId)(local_338->fedID).gid);
        if ((bVar1) && ((local_338->dependent & 1U) != 0)) {
          sendUpdatedExecRequest
                    (in_stack_fffffffffffffd68,in_stack_fffffffffffffd74,in_stack_fffffffffffffd70,
                     in_stack_fffffffffffffd64);
        }
        else {
          gid.gid._2_1_ = in_stack_fffffffffffffc7e;
          gid.gid._0_2_ = in_stack_fffffffffffffc7c;
          gid.gid._3_1_ = cVar8;
          pDVar6 = TimeDependencies::getDependencyInfo
                             ((TimeDependencies *)in_stack_fffffffffffffc70,gid);
          if ((pDVar6->dependent & 1U) != 0) {
            sendUpdatedExecRequest
                      (in_stack_fffffffffffffd68,in_stack_fffffffffffffd74,in_stack_fffffffffffffd70
                       ,in_stack_fffffffffffffd64);
          }
        }
      }
    }
    else {
      memset(&local_344,0,4);
      GlobalFederateId::GlobalFederateId(&local_344);
      sendUpdatedExecRequest
                (in_stack_fffffffffffffd68,in_stack_fffffffffffffd74,in_stack_fffffffffffffd70,
                 in_stack_fffffffffffffd64);
    }
  }
  return local_11;
}

Assistant:

MessageProcessingResult TimeCoordinator::checkExecEntry(GlobalFederateId triggerFed)
{
    auto ret = MessageProcessingResult::CONTINUE_PROCESSING;
    if (time_block <= timeZero) {
        return ret;
    }
    if (!dependencies.checkIfReadyForExecEntry(iterating != IterationRequest::NO_ITERATIONS,
                                               info.wait_for_current_time_updates)) {
        if (!hasInitUpdates) {
            if (triggerFed.isValid() && iterating != IterationRequest::NO_ITERATIONS) {
                if (dependencies.checkIfReadyForExecEntry(false, false)) {
                    // if we are just continuing but would have granted in other circumstances
                    const auto& mfed = getExecEntryMinFederate(dependencies, mSourceId);
                    if (mfed.fedID == triggerFed) {
                        sendUpdatedExecRequest(triggerFed,
                                               GlobalFederateId{},
                                               mfed.sequenceCounter);
                    } else {
                        const auto* tfed = dependencies.getDependencyInfo(triggerFed);
                        if (tfed->dependent) {
                            sendUpdatedExecRequest(triggerFed,
                                                   GlobalFederateId{},
                                                   tfed->sequenceCounter);
                        }
                    }
                } else {
                    needSendAll = true;
                }
            }
        }
        return ret;
    }
    bool sendAll{needSendAll};
    needSendAll = false;
    switch (iterating) {
        case IterationRequest::NO_ITERATIONS:
            if (!info.wait_for_current_time_updates) {
                ret = MessageProcessingResult::NEXT_STEP;
            } else {
                // on wait for current time flag all other federates must have entered exec mode
                total = generateMinTimeTotal(dependencies,
                                             info.restrictive_time_policy || globalTime,
                                             mSourceId,
                                             mSourceId,
                                             sequenceCounter);
                if (total.next > timeZero) {
                    ret = MessageProcessingResult::NEXT_STEP;
                }
            }
            break;
        case IterationRequest::ITERATE_IF_NEEDED:
        case IterationRequest::FORCE_ITERATION:
            if (iteration >= info.maxIterations) {
                if (iterating == IterationRequest::FORCE_ITERATION) {
                    ret = MessageProcessingResult::ITERATING;
                } else {
                    ret = MessageProcessingResult::NEXT_STEP;
                }
                break;
            }
            if (hasInitUpdates) {
                ret = MessageProcessingResult::ITERATING;
            } else {
                if ((dependencies.checkIfReadyForExecEntry(false,
                                                           info.wait_for_current_time_updates)) ||
                    (info.wait_for_current_time_updates &&
                     dependencies.checkIfAllDependenciesArePastExec(true))) {
                    ret = (iterating == IterationRequest::FORCE_ITERATION) ?
                        MessageProcessingResult::ITERATING :
                        MessageProcessingResult::NEXT_STEP;
                } else {
                    bool allowed{!info.wait_for_current_time_updates};
                    bool restricted{info.restrictive_time_policy};
                    bool restrictionAdvance{restricted};
                    int restrictionLevel{50};
                    if (allowed) {
                        for (const auto& dep : dependencies) {
                            if (!dep.dependency) {
                                continue;
                            }
                            if (dep.mTimeState == TimeState::initialized) {
                                allowed = false;
                                restrictionAdvance = false;
                                break;
                            }
                            if (dep.mTimeState >= TimeState::exec_requested) {
                                continue;
                            }
                            if (dep.minFed != mSourceId) {
                                allowed = false;
                            }
                            if (dep.responseSequenceCounter == sequenceCounter) {
                                if (restricted) {
                                    restrictionLevel =
                                        (std::min)(restrictionLevel,
                                                   static_cast<int>(dep.restrictionLevel));
                                }

                            } else {
                                restrictionAdvance = false;
                                allowed = false;
                                break;
                            }
                        }
                    }
                    if (allowed) {
                        if (restricted) {
                            if (restrictionLevel >= 1) {
                                ret = (iterating == IterationRequest::FORCE_ITERATION) ?
                                    MessageProcessingResult::ITERATING :
                                    MessageProcessingResult::NEXT_STEP;
                            } else {
                                if (currentRestrictionLevel != restrictionLevel + 1) {
                                    currentRestrictionLevel = restrictionLevel + 1;
                                    sendAll = true;
                                    ++sequenceCounter;
                                }

                                ret = MessageProcessingResult::CONTINUE_PROCESSING;
                            }
                        } else {
                            ret = (iterating == IterationRequest::FORCE_ITERATION) ?
                                MessageProcessingResult::ITERATING :
                                MessageProcessingResult::NEXT_STEP;
                        }

                    } else {
                        if (restrictionAdvance) {
                            currentRestrictionLevel = restrictionLevel + 1;
                            sendAll = true;
                            ++sequenceCounter;
                        }
                        ret = MessageProcessingResult::CONTINUE_PROCESSING;
                    }
                }
            }
            break;
        default:
            break;
    }
    if (!dynamicJoining) {
        if (ret == MessageProcessingResult::NEXT_STEP) {
            time_granted = timeZero;
            time_grantBase = time_granted;
            executionMode = true;
            iteration = 0;
            currentRestrictionLevel = 0;
            ActionMessage execgrant(CMD_EXEC_GRANT);
            execgrant.source_id = mSourceId;
            execgrant.setExtraDestData(TIME_COORDINATOR_VERSION);  // version
            transmitTimingMessages(execgrant);
        } else if (ret == MessageProcessingResult::ITERATING) {
            dependencies.resetIteratingExecRequests();
            hasInitUpdates = false;
            ++iteration;
            ActionMessage execgrant(CMD_EXEC_GRANT);
            execgrant.source_id = mSourceId;
            execgrant.counter = iteration;
            execgrant.setExtraDestData(TIME_COORDINATOR_VERSION);  // version
            setActionFlag(execgrant, iteration_requested_flag);
            transmitTimingMessages(execgrant);
            currentRestrictionLevel = 0;
        }
    } else {
        if (ret == MessageProcessingResult::NEXT_STEP) {
            updateTimeFactors();
            if (dependencyCount() > 0) {
                time_granted =
                    generateAllowedTime(total.next) - (std::max)(info.period, info.timeDelta);
            } else {
                time_granted = timeZero;
            }
            time_grantBase = time_granted;
            executionMode = true;
            iteration = 0;
            currentRestrictionLevel = 0;
            ActionMessage execgrant(time_granted > timeZero ? CMD_TIME_GRANT : CMD_EXEC_GRANT);
            execgrant.source_id = mSourceId;
            execgrant.actionTime = time_granted;
            execgrant.setExtraDestData(TIME_COORDINATOR_VERSION);  // version
            transmitTimingMessages(execgrant);
        }
    }
    if (triggerFed.isValid() && ret == MessageProcessingResult::CONTINUE_PROCESSING &&
        iterating != IterationRequest::NO_ITERATIONS) {
        // if we are just continuing
        const auto& mfed = getExecEntryMinFederate(dependencies, mSourceId);
        if (sendAll) {
            sendUpdatedExecRequest(GlobalFederateId{}, mfed.fedID, mfed.sequenceCounter);
        } else {
            if (triggerFed != mSourceId) {
                if (triggerFed == mfed.fedID && mfed.dependent) {
                    sendUpdatedExecRequest(triggerFed, mfed.fedID, mfed.sequenceCounter);
                } else {
                    const auto* tfed = dependencies.getDependencyInfo(triggerFed);
                    if (tfed->dependent) {
                        sendUpdatedExecRequest(triggerFed, mfed.fedID, tfed->sequenceCounter);
                    }
                }
            }
        }
    }
    return ret;
}